

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

void fy_emit_token_write_plain(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  fy_emitter_cfg_flags fVar1;
  fy_emitter *pfVar2;
  size_t sVar3;
  bool bVar4;
  fy_atom_style fVar5;
  fy_emitter_cfg_flags fVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  fy_atom *atom;
  char *str;
  bool bVar10;
  bool bVar11;
  fy_emitter_write_type type;
  size_t len;
  fy_atom_iter iter;
  size_t local_220;
  fy_atom_iter local_218;
  
  local_220 = 0;
  if ((fyt != (fy_token *)0x0) ||
     (fVar1 = emit->cfg->flags,
     (fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE)) {
    type = fyewt_plain_scalar_key;
    if ((flags & 0x40U) == 0) {
      type = fyewt_plain_scalar;
    }
    atom = fy_token_atom(fyt);
    fVar1 = emit->cfg->flags;
    if (((fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE) &&
       ((atom == (fy_atom *)0x0 || fyt == (fy_token *)0x0 || ((atom->field_0x36 & 0x10) != 0)))) {
      str = "null";
      iVar7 = 4;
    }
    else {
      str = fy_token_get_direct_output(fyt,&local_220);
      if ((str == (char *)0x0) || (fVar5 = fy_token_atom_style(fyt), fVar5 != FYAS_PLAIN)) {
        if (atom != (fy_atom *)0x0) {
          if ((flags & 8U) == 0) {
            fVar1 = emit->cfg->flags;
            fVar6 = fVar1 & 0xf00000;
            bVar10 = fVar6 != FYECF_MODE_FLOW_ONELINE &&
                     (fVar6 != FYECF_MODE_JSON_ONELINE && (fVar1 & 0xe00000) != FYECF_MODE_JSON);
          }
          else {
            bVar10 = false;
          }
          fy_atom_iter_start(atom,&local_218);
          pfVar2 = (emit->ea).emit;
          if (pfVar2 == (fy_emitter *)0x0) {
            __assert_fail("ea->emit",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-emit.h"
                          ,0x85,
                          "void fy_emit_accum_start(struct fy_emit_accum *, enum fy_emitter_write_type)"
                         );
          }
          iVar7 = pfVar2->column;
          (emit->ea).start_col = iVar7;
          (emit->ea).type = type;
          (emit->ea).next = 0;
          (emit->ea).utf8_count = 0;
          (emit->ea).col = iVar7;
          iVar7 = fy_atom_iter_utf8_get(&local_218);
          if (0 < iVar7) {
            bVar11 = false;
            bVar4 = false;
            do {
              if (iVar7 < 0x20) {
                if (iVar7 == 9) {
LAB_00126e74:
                  if ((!bVar10) || (bVar11)) {
LAB_00126f6a:
                    fy_emit_accum_utf8_put(&emit->ea,iVar7);
                  }
                  else {
                    uVar8 = emit->cfg->flags >> 0xc;
                    if ((char)uVar8 == '\0') {
                      uVar8 = 0x50;
                    }
                    else if ((uVar8 & 0xff) == 0xff) {
                      uVar8 = 0x7fffffff;
                    }
                    else {
                      uVar8 = uVar8 & 0xff;
                    }
                    if ((((emit->ea).col <= (int)uVar8) ||
                        (iVar9 = fy_atom_iter_utf8_peek(&local_218), iVar9 == 9)) || (iVar9 == 0x20)
                       ) goto LAB_00126f6a;
                    sVar3 = (emit->ea).next;
                    if (sVar3 != 0) {
                      fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar3);
                    }
                    (emit->ea).next = 0;
                    (emit->ea).utf8_count = 0;
                    (emit->ea).col = (emit->ea).start_col;
                    *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                    fy_emit_write_indent(emit,indent);
                  }
                  bVar11 = true;
                }
                else {
                  if ((iVar7 == 10) || (iVar7 == 0xd)) goto LAB_00126eb1;
LAB_00126f1b:
                  if (bVar4) {
                    fy_emit_write_indent(emit,indent);
                  }
                  fy_emit_accum_utf8_put(&emit->ea,iVar7);
                  *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                  bVar4 = false;
                  bVar11 = false;
                }
              }
              else {
                if ((1 < iVar7 - 0x2028U) && (iVar7 != 0x85)) {
                  if (iVar7 != 0x20) goto LAB_00126f1b;
                  goto LAB_00126e74;
                }
LAB_00126eb1:
                if (!bVar10) break;
                if (!bVar4) {
                  sVar3 = (emit->ea).next;
                  if (sVar3 != 0) {
                    fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar3);
                  }
                  (emit->ea).next = 0;
                  (emit->ea).utf8_count = 0;
                  (emit->ea).col = (emit->ea).start_col;
                  fy_emit_write_indent(emit,indent);
                }
                *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                fy_emit_write_indent(emit,indent);
                bVar4 = true;
              }
              iVar7 = fy_atom_iter_utf8_get(&local_218);
            } while (0 < iVar7);
          }
          sVar3 = (emit->ea).next;
          if (sVar3 != 0) {
            fy_emit_write((emit->ea).emit,(emit->ea).type,(emit->ea).accum,(int)sVar3);
          }
          (emit->ea).next = 0;
          (emit->ea).utf8_count = 0;
          (emit->ea).col = (emit->ea).start_col;
          fy_atom_iter_finish(&local_218);
        }
        goto LAB_00127033;
      }
      iVar7 = (int)local_220;
    }
    fy_emit_write(emit,type,str,iVar7);
  }
LAB_00127033:
  *(byte *)&emit->flags = (byte)emit->flags & 0xfc;
  return;
}

Assistant:

void fy_emit_token_write_plain(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool allow_breaks, should_indent, spaces, breaks;
    int c;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    /* null and not json mode */
    if (!fyt && !fy_emit_is_json_mode(emit))
        goto out;

    wtype = (flags & DDNF_SIMPLE_SCALAR_KEY) ? fyewt_plain_scalar_key : fyewt_plain_scalar;

    atom = fy_token_atom(fyt);

    /* null and json mode */
    if (fy_emit_is_json_mode(emit) && (!fyt || !atom || atom->size0)) {
        fy_emit_puts(emit, wtype, "null");
        goto out;
    }

    /* simple case first (90% of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == FYAS_PLAIN) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_ws(c)) {

            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent && !fy_is_ws(fy_atom_iter_utf8_peek(&iter))) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;

        } else if (fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;

        } else {

            if (breaks)
                fy_emit_write_indent(emit, indent);

            fy_emit_accum_utf8_put(&emit->ea, c);

            emit->flags &= ~FYEF_INDENTATION;

            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
}